

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O1

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  uint uVar1;
  int iVar2;
  kiss_fft_cpx kVar3;
  kiss_fft_cpx *__ptr;
  long lVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  kiss_fft_cpx *pkVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  long local_68;
  kiss_fft_cpx *local_60;
  int local_58;
  
  uVar1 = *factors;
  iVar11 = factors[1];
  lVar4 = (long)iVar11;
  if (lVar4 == 1) {
    lVar5 = 0;
    do {
      *(kiss_fft_cpx *)((long)&Fout->r + lVar5) = *f;
      f = f + (long)in_stride * fstride;
      lVar5 = lVar5 + 8;
    } while ((long)(int)(iVar11 * uVar1) * 8 != lVar5);
  }
  else {
    lVar5 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar5),f,(long)(int)uVar1 * fstride,in_stride,
              factors + 2,st);
      f = f + (long)in_stride * fstride;
      lVar5 = lVar5 + lVar4 * 8;
    } while ((long)(int)(iVar11 * uVar1) * 8 != lVar5);
  }
  switch(uVar1) {
  case 2:
    pfVar6 = &st->twiddles[0].i;
    lVar5 = 0;
    do {
      fVar19 = Fout[lVar4 + lVar5].r * ((kiss_fft_cpx *)(pfVar6 + -1))->r -
               *pfVar6 * Fout[lVar4 + lVar5].i;
      fVar17 = Fout[lVar4 + lVar5].r * *pfVar6 +
               ((kiss_fft_cpx *)(pfVar6 + -1))->r * Fout[lVar4 + lVar5].i;
      Fout[lVar4 + lVar5].r = Fout[lVar5].r - fVar19;
      Fout[lVar4 + lVar5].i = Fout[lVar5].i - fVar17;
      Fout[lVar5].r = fVar19 + Fout[lVar5].r;
      Fout[lVar5].i = fVar17 + Fout[lVar5].i;
      lVar5 = lVar5 + 1;
      pfVar6 = pfVar6 + fstride * 2;
    } while (iVar11 != (int)lVar5);
    break;
  case 3:
    fVar17 = st->twiddles[lVar4 * fstride].i;
    pfVar6 = &Fout->i;
    lVar10 = 0;
    lVar5 = lVar4;
    do {
      fVar19 = *(float *)((long)&st->twiddles[0].r + lVar10);
      fVar15 = *(float *)((long)&st->twiddles[0].i + lVar10);
      fVar23 = pfVar6[lVar4 * 2 + -1] * fVar19 - fVar15 * pfVar6[lVar4 * 2];
      fVar18 = pfVar6[lVar4 * 2 + -1] * fVar15 + fVar19 * pfVar6[lVar4 * 2];
      fVar19 = *(float *)((long)&st->twiddles[0].r + lVar10 * 2);
      fVar15 = *(float *)((long)&st->twiddles[0].i + lVar10 * 2);
      fVar21 = pfVar6[lVar4 * 4 + -1] * fVar19 - fVar15 * pfVar6[lVar4 * 4];
      fVar19 = pfVar6[lVar4 * 4 + -1] * fVar15 + fVar19 * pfVar6[lVar4 * 4];
      fVar26 = fVar23 + fVar21;
      fVar16 = fVar18 + fVar19;
      pfVar6[lVar4 * 2 + -1] = ((kiss_fft_cpx *)(pfVar6 + -1))->r - fVar26 * 0.5;
      pfVar6[lVar4 * 2] = *pfVar6 - fVar16 * 0.5;
      fVar15 = (fVar23 - fVar21) * fVar17;
      fVar19 = (fVar18 - fVar19) * fVar17;
      ((kiss_fft_cpx *)(pfVar6 + -1))->r = fVar26 + ((kiss_fft_cpx *)(pfVar6 + -1))->r;
      *pfVar6 = fVar16 + *pfVar6;
      pfVar6[lVar4 * 4 + -1] = pfVar6[lVar4 * 2 + -1] + fVar19;
      pfVar6[lVar4 * 4] = pfVar6[lVar4 * 2] - fVar15;
      pfVar6[lVar4 * 2 + -1] = pfVar6[lVar4 * 2 + -1] - fVar19;
      pfVar6[lVar4 * 2] = fVar15 + pfVar6[lVar4 * 2];
      lVar10 = lVar10 + fstride * 8;
      pfVar6 = pfVar6 + 2;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    break;
  case 4:
    iVar11 = st->inverse;
    pfVar7 = &st->twiddles[0].i;
    lVar5 = 0;
    lVar10 = 0;
    pfVar6 = pfVar7;
    do {
      fVar17 = *(float *)((long)&st->twiddles[0].r + lVar10);
      fVar15 = Fout[lVar4 + lVar5].r * fVar17 -
               *(float *)((long)pfVar7 + lVar10) * Fout[lVar4 + lVar5].i;
      fVar18 = Fout[lVar4 + lVar5].r * *(float *)((long)pfVar7 + lVar10) +
               fVar17 * Fout[lVar4 + lVar5].i;
      fVar17 = *(float *)((long)&st->twiddles[0].r + lVar10 * 2);
      fVar19 = *(float *)((long)pfVar7 + lVar10 * 2);
      fVar23 = Fout[lVar4 * 2 + lVar5].r * fVar17 - fVar19 * Fout[lVar4 * 2 + lVar5].i;
      fVar17 = Fout[lVar4 * 2 + lVar5].r * fVar19 + fVar17 * Fout[lVar4 * 2 + lVar5].i;
      fVar24 = Fout[lVar4 * 3 + lVar5].r * ((kiss_fft_cpx *)(pfVar6 + -1))->r -
               *pfVar6 * Fout[lVar4 * 3 + lVar5].i;
      fVar26 = Fout[lVar4 * 3 + lVar5].r * *pfVar6 +
               ((kiss_fft_cpx *)(pfVar6 + -1))->r * Fout[lVar4 * 3 + lVar5].i;
      fVar16 = Fout[lVar5].r - fVar23;
      fVar19 = Fout[lVar5].i - fVar17;
      fVar23 = fVar23 + Fout[lVar5].r;
      Fout[lVar5].r = fVar23;
      fVar17 = fVar17 + Fout[lVar5].i;
      Fout[lVar5].i = fVar17;
      fVar21 = fVar15 + fVar24;
      fVar30 = fVar18 + fVar26;
      fVar15 = fVar15 - fVar24;
      Fout[lVar4 * 2 + lVar5].r = fVar23 - fVar21;
      Fout[lVar4 * 2 + lVar5].i = fVar17 - fVar30;
      fVar18 = fVar18 - fVar26;
      Fout[lVar5].r = fVar21 + Fout[lVar5].r;
      Fout[lVar5].i = fVar30 + Fout[lVar5].i;
      if (iVar11 == 0) {
        Fout[lVar4 + lVar5].r = fVar16 + fVar18;
        Fout[lVar4 + lVar5].i = fVar19 - fVar15;
        Fout[lVar4 * 3 + lVar5].r = fVar16 - fVar18;
        fVar17 = fVar19 + fVar15;
      }
      else {
        fVar17 = fVar19 - fVar15;
        Fout[lVar4 + lVar5].r = fVar16 - fVar18;
        Fout[lVar4 + lVar5].i = fVar19 + fVar15;
        Fout[lVar4 * 3 + lVar5].r = fVar16 + fVar18;
      }
      Fout[lVar4 * 3 + lVar5].i = fVar17;
      pfVar6 = pfVar6 + fstride * 6;
      lVar10 = lVar10 + fstride * 8;
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
    break;
  case 5:
    if (0 < iVar11) {
      lVar5 = lVar4 * fstride;
      fVar17 = st->twiddles[lVar5].r;
      fVar19 = st->twiddles[lVar5].i;
      fVar15 = st->twiddles[lVar5 * 2].r;
      fVar18 = st->twiddles[lVar5 * 2].i;
      lVar5 = 0;
      lVar10 = 0;
      lVar13 = 0;
      do {
        fVar23 = *(float *)((long)&Fout->r + lVar5);
        fVar26 = *(float *)((long)&Fout->i + lVar5);
        fVar16 = *(float *)((long)&Fout[lVar4].r + lVar5);
        fVar21 = *(float *)((long)&Fout[lVar4].i + lVar5);
        fVar24 = *(float *)((long)&st->twiddles[0].r + lVar13);
        fVar30 = *(float *)((long)&st->twiddles[0].i + lVar13);
        fVar22 = fVar16 * fVar24 - fVar30 * fVar21;
        fVar27 = fVar16 * fVar30 + fVar24 * fVar21;
        fVar16 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar5);
        fVar21 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar5);
        fVar24 = *(float *)((long)&st->twiddles[0].r + lVar13 * 2);
        fVar30 = *(float *)((long)&st->twiddles[0].i + lVar13 * 2);
        fVar28 = fVar16 * fVar24 - fVar30 * fVar21;
        fVar25 = fVar16 * fVar30 + fVar24 * fVar21;
        fVar16 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar5);
        fVar21 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].i + lVar5);
        fVar24 = st->twiddles[lVar10].r;
        fVar30 = st->twiddles[lVar10].i;
        fVar20 = fVar16 * fVar24 - fVar30 * fVar21;
        fVar33 = fVar16 * fVar30 + fVar24 * fVar21;
        fVar16 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar5);
        fVar21 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].i + lVar5);
        fVar24 = (&st->twiddles[0].r)[lVar13];
        fVar30 = (&st->twiddles[0].i)[lVar13];
        fVar29 = fVar16 * fVar24 - fVar30 * fVar21;
        fVar16 = fVar16 * fVar30 + fVar24 * fVar21;
        fVar32 = fVar22 + fVar29;
        fVar31 = fVar27 + fVar16;
        fVar22 = fVar22 - fVar29;
        fVar27 = fVar27 - fVar16;
        fVar29 = fVar28 + fVar20;
        fVar30 = fVar25 + fVar33;
        fVar28 = fVar28 - fVar20;
        fVar25 = fVar25 - fVar33;
        *(float *)((long)&Fout->r + lVar5) = fVar29 + fVar32 + fVar23;
        *(float *)((long)&Fout->i + lVar5) = fVar30 + fVar31 + fVar26;
        fVar21 = fVar29 * fVar15 + fVar32 * fVar17 + fVar23;
        fVar20 = fVar30 * fVar15 + fVar31 * fVar17 + fVar26;
        fVar24 = fVar27 * fVar19 + fVar18 * fVar25;
        fVar16 = -fVar22 * fVar19 - fVar18 * fVar28;
        *(float *)((long)&Fout[lVar4].r + lVar5) = fVar21 - fVar24;
        *(float *)((long)&Fout[lVar4].i + lVar5) = fVar20 - fVar16;
        *(float *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar5) = fVar24 + fVar21;
        *(float *)((long)&Fout[(uint)(iVar11 * 4)].i + lVar5) = fVar16 + fVar20;
        fVar21 = fVar29 * fVar17 + fVar32 * fVar15 + fVar23;
        fVar16 = fVar30 * fVar17 + fVar31 * fVar15 + fVar26;
        fVar26 = fVar25 * fVar19 - fVar27 * fVar18;
        fVar23 = fVar22 * fVar18 - fVar28 * fVar19;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar5) = fVar26 + fVar21;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar5) = fVar16 + fVar23;
        *(float *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar5) = fVar21 - fVar26;
        *(float *)((long)&Fout[(uint)(iVar11 * 3)].i + lVar5) = fVar16 - fVar23;
        lVar13 = lVar13 + fstride * 8;
        lVar10 = lVar10 + fstride * 3;
        lVar5 = lVar5 + 8;
      } while (lVar4 << 3 != lVar5);
    }
    break;
  default:
    iVar2 = st->nfft;
    __ptr = (kiss_fft_cpx *)malloc((long)(int)uVar1 * 8);
    if (0 < iVar11) {
      local_68 = 0;
      local_60 = Fout;
      do {
        if (0 < (int)uVar1) {
          uVar12 = 0;
          pkVar9 = local_60;
          do {
            __ptr[uVar12] = *pkVar9;
            uVar12 = uVar12 + 1;
            pkVar9 = pkVar9 + lVar4;
          } while (uVar1 != uVar12);
          if (0 < (int)uVar1) {
            kVar3 = *__ptr;
            uVar14 = 0;
            lVar5 = local_68;
            do {
              Fout[lVar5] = kVar3;
              if (1 < (int)uVar1) {
                local_58 = (int)fstride;
                fVar17 = Fout[lVar5].r;
                fVar19 = Fout[lVar5].i;
                lVar10 = 0;
                iVar11 = 0;
                do {
                  iVar11 = iVar11 + (int)lVar5 * local_58;
                  iVar8 = iVar2;
                  if (iVar11 < iVar2) {
                    iVar8 = 0;
                  }
                  iVar11 = iVar11 - iVar8;
                  fVar15 = st->twiddles[iVar11].r;
                  fVar18 = st->twiddles[iVar11].i;
                  fVar17 = fVar17 + (__ptr[lVar10 + 1].r * fVar15 - fVar18 * __ptr[lVar10 + 1].i);
                  fVar19 = fVar19 + __ptr[lVar10 + 1].r * fVar18 + fVar15 * __ptr[lVar10 + 1].i;
                  Fout[lVar5].r = fVar17;
                  Fout[lVar5].i = fVar19;
                  lVar10 = lVar10 + 1;
                } while ((ulong)uVar1 - 1 != lVar10);
              }
              lVar5 = lVar5 + lVar4;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar1);
          }
        }
        local_68 = local_68 + 1;
        local_60 = local_60 + 1;
      } while (local_68 != lVar4);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
    if (fstride==1 && p<=5)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}